

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_id.cpp
# Opt level: O2

spv_result_t spvtools::val::UpdateIdUse(ValidationState_t *_,Instruction *inst)

{
  uint32_t id;
  pointer psVar1;
  bool bVar2;
  Instruction *this;
  spv_parsed_operand_t *operand;
  pointer psVar3;
  
  psVar1 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (psVar3 = (inst->operands_).
                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    id = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[psVar3->offset];
    bVar2 = spvIsIdType(psVar3->type);
    if ((bVar2) && (psVar3->type != SPV_OPERAND_TYPE_RESULT_ID)) {
      this = ValidationState_t::FindDef(_,id);
      if (this != (Instruction *)0x0) {
        Instruction::RegisterUse(this,inst,(uint)psVar3->offset);
      }
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t UpdateIdUse(ValidationState_t& _, const Instruction* inst) {
  for (auto& operand : inst->operands()) {
    const spv_operand_type_t& type = operand.type;
    const uint32_t operand_id = inst->word(operand.offset);
    if (spvIsIdType(type) && type != SPV_OPERAND_TYPE_RESULT_ID) {
      if (auto def = _.FindDef(operand_id))
        def->RegisterUse(inst, operand.offset);
    }
  }

  return SPV_SUCCESS;
}